

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataDrawBuffersCase::iterate
          (FragDataDrawBuffersCase *this)

{
  pointer pbVar1;
  RenderContext *renderCtx;
  code *pcVar2;
  ObjectWrapper *pOVar3;
  value_type *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar10;
  NotSupportedError *this_00;
  TestError *this_01;
  byte bVar11;
  RGBA expectedColor;
  char *description;
  int ndx;
  long lVar12;
  long *plVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  void *data;
  bool bVar18;
  Vec4 VVar19;
  Surface result;
  deUint8 indices [6];
  float positions [8];
  float colors [16];
  Renderbuffer colorBuf1;
  Renderbuffer colorBuf0;
  Framebuffer fbo;
  VertexArrayBinding vertexArrays [2];
  deUint32 drawBuffers [2];
  ShaderProgram program;
  undefined4 local_434;
  Surface local_428;
  FragDataDrawBuffersCase *local_408;
  undefined1 local_400 [8];
  char *local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3f0;
  undefined1 *puStack_3e0;
  TextureFormat local_3d8;
  long local_3d0;
  long local_3c8 [2];
  uint local_3b8 [2];
  value_type vStack_3b0;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ObjectWrapper local_370;
  ObjectWrapper local_358;
  ObjectWrapper local_340;
  undefined1 local_328 [8];
  value_type local_320;
  int local_300;
  VertexComponentType local_2f8;
  VertexComponentConversion VStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  string *local_2e0;
  deUint32 local_2d8;
  long *local_2d0 [2];
  long local_2c0 [3];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined4 local_298;
  uint *local_290;
  undefined1 local_280 [8];
  pointer local_278;
  undefined1 local_270 [104];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  undefined4 extraout_var_03;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  local_408 = this;
  memset(local_280,0,0xac);
  local_3f8 = aStack_3f0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  __x = &(((VertexArrayBinding *)local_328)->binding).name;
  local_328._0_4_ = TYPE_LOCATION;
  paVar4 = &(((VertexArrayBinding *)local_328)->binding).name.field_2;
  local_320._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__x,local_3f8,local_3f8 + aStack_3f0._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (ulong)(uint)local_328._0_4_ * 0x18),__x);
  puVar5 = &local_428.m_pixels.m_cap;
  local_428._0_8_ = puVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_428,
             "varying mediump vec4 v_color;\nuniform mediump int u_index;\nvoid main (void)\n{\n\tgl_FragData[u_index] = v_color;\n}\n"
             ,"");
  local_3b8[0] = 1;
  vStack_3b0._M_dataplus._M_p = (pointer)&vStack_3b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vStack_3b0,local_428._0_8_,(long)local_428.m_pixels.m_ptr + local_428._0_8_)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (ulong)local_3b8[0] * 0x18),&vStack_3b0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_3b0._M_dataplus._M_p != &vStack_3b0.field_2) {
    operator_delete(vStack_3b0._M_dataplus._M_p,vStack_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined8 *)local_428._0_8_ != puVar5) {
    operator_delete((void *)local_428._0_8_,local_428.m_pixels.m_cap + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar4) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_3f8 != aStack_3f0._M_local_buf + 8) {
    operator_delete(local_3f8,aStack_3f0._8_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar7);
  local_434 = 0xffffffff;
  if (local_100.m_program.m_info.linkOk == true) {
    local_434 = (**(code **)(lVar12 + 0xb48))(local_100.m_program.m_program,"u_index");
  }
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_340,(Functions *)CONCAT44(extraout_var_00,iVar7),pOVar9);
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_358,(Functions *)CONCAT44(extraout_var_01,iVar7),pOVar9);
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_370,(Functions *)CONCAT44(extraout_var_02,iVar7),pOVar9);
  aStack_3f0._8_8_ = 0x3f800000bf800000;
  puStack_3e0 = &DAT_3f8000003f800000;
  local_3f8 = (char *)0xbf800000bf800000;
  aStack_3f0._M_allocated_capacity = 0xbf8000003f800000;
  local_388 = 0x3f80000000000000;
  uStack_380 = 0x3f80000000000000;
  vStack_3b0.field_2._8_8_ = 0x3f80000000000000;
  uStack_390 = 0x3f80000000000000;
  vStack_3b0._M_string_length = 0x3f80000000000000;
  vStack_3b0.field_2._M_allocated_capacity = 0x3f80000000000000;
  local_3b8[0] = 0;
  local_3b8[1] = 0x3f800000;
  vStack_3b0._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_400._4_2_ = 0x301;
  local_400._0_4_ = 0x2020100;
  local_428._0_8_ = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"a_position","");
  local_280._0_4_ = 1;
  pbVar1 = (pointer)(local_270 + 8);
  local_278 = pbVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,local_428._0_8_,(long)local_428.m_pixels.m_ptr + local_428._0_8_);
  local_270._24_4_ = 0;
  local_328._0_4_ = local_280._0_4_;
  local_320._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(((VertexArrayBinding *)local_328)->binding).name,local_278,
             (pointer)((long)&(local_278->_M_dataplus)._M_p + local_270._0_8_));
  local_300 = local_270._24_4_;
  local_2f8 = VTX_COMP_FLOAT;
  VStack_2f4 = VTX_COMP_CONVERT_NONE;
  iStack_2f0 = 2;
  iStack_2ec = 4;
  local_2e8 = 0;
  local_2e0 = (string *)&local_3f8;
  if (local_278 != pbVar1) {
    operator_delete(local_278,(ulong)(local_270._8_8_ + 1));
  }
  local_3d8 = (TextureFormat)local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"a_color","");
  local_280._0_4_ = 1;
  local_278 = pbVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,local_3d8,local_3d0 + (long)local_3d8);
  local_270._24_4_ = 0;
  local_2d8 = local_280._0_4_;
  plVar13 = local_2c0;
  local_2d0[0] = plVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,local_278,
             (pointer)((long)&(local_278->_M_dataplus)._M_p + local_270._0_8_));
  local_2c0[2]._0_4_ = local_270._24_4_;
  local_2a8 = 8;
  uStack_2a0 = 0x400000004;
  local_298 = 0;
  local_290 = local_3b8;
  if (local_278 != pbVar1) {
    operator_delete(local_278,(ulong)(local_270._8_8_ + 1));
  }
  if (local_3d8 != (TextureFormat)local_3c8) {
    operator_delete((void *)local_3d8,local_3c8[0] + 1);
  }
  if ((undefined8 *)local_428._0_8_ != puVar5) {
    operator_delete((void *)local_428._0_8_,local_428.m_pixels.m_cap + 1);
  }
  glu::operator<<(((local_408->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_280 = (undefined1  [8])local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"Dynamic indexing of gl_FragData[] not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_280);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar12 + 0x78))(0x8d40,local_340.m_object);
  iVar7 = 0;
  uVar16 = 0;
  do {
    bVar18 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    pOVar3 = &local_370;
    if (bVar18) {
      pOVar3 = &local_358;
    }
    dVar8 = pOVar3->m_object;
    (**(code **)(lVar12 + 0xa0))(0x8d41,dVar8);
    (**(code **)(lVar12 + 0x1238))(0x8d41,0x8058,0x80,0x80);
    (**(code **)(lVar12 + 0x688))(0x8d40,uVar16 | 0x8ce0,0x8d41,dVar8);
    bVar18 = uVar16 == 0;
    uVar16 = uVar16 + 1;
  } while (bVar18);
  iVar7 = (**(code **)(lVar12 + 0x170))(0x8d40);
  if (iVar7 == 0x8cd5) {
    local_280 = (undefined1  [8])0x8ce100008ce0;
    (**(code **)(lVar12 + 0x560))(2);
    pcVar2 = *(code **)(lVar12 + 0x1a8);
    local_428.m_width = -0xffff01;
    VVar19 = tcu::RGBA::toVec((RGBA *)local_280);
    (*pcVar2)(VVar19.m_data[0],VVar19.m_data._8_8_,0x1800,0,local_280);
    pcVar2 = *(code **)(lVar12 + 0x1a8);
    local_428.m_width = -0xffff01;
    VVar19 = tcu::RGBA::toVec((RGBA *)local_280);
    (*pcVar2)(VVar19.m_data[0],VVar19.m_data._8_8_,0x1800,1,local_280);
    (**(code **)(lVar12 + 0x1a00))(0,0,0x80,0x80);
    (**(code **)(lVar12 + 0x1680))(local_100.m_program.m_program);
    dVar8 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar8,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0x131);
    local_280 = (undefined1  [8])
                ((local_408->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,
               "Drawing to attachments 0 and 1, expecting only attachment 0 to change.",0x46);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
    std::ios_base::~ios_base(local_208);
    iVar7 = 0;
    do {
      (**(code **)(lVar12 + 0x14f0))(local_434,iVar7);
      local_280 = (undefined1  [8])0x600000000;
      local_278 = (pointer)((ulong)local_278 & 0xffffffff00000000);
      local_270._0_8_ = (pointer)local_400;
      glu::draw(renderCtx,local_100.m_program.m_program,2,(VertexArrayBinding *)local_328,
                (PrimitiveList *)local_280,(DrawUtilCallback *)0x0);
      iVar7 = iVar7 + 1;
    } while (iVar7 == 1);
    dVar8 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar8,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0x13b);
    tcu::Surface::Surface(&local_428,0x80,0x80);
    iVar7 = (*renderCtx->_vptr_RenderContext[4])();
    lVar10 = CONCAT44(extraout_var_03,iVar7);
    uVar16 = 0x1000000 << (8U - (char)*(int *)(lVar10 + 0x14) & 0x1f);
    bVar11 = 8 - *(char *)(lVar10 + 8);
    if (*(int *)(lVar10 + 0x14) < 1) {
      uVar16 = 0;
    }
    uVar15 = 0x100 << (8U - *(char *)(lVar10 + 0xc) & 0x1f) | 1 << (bVar11 & 0x1f);
    uVar16 = 0x10000 << (8U - *(char *)(lVar10 + 0x10) & 0x1f) | uVar15 | uVar16;
    uVar14 = 1 << (bVar11 & 0x1f) & 0xff;
    if (0xfd < uVar14) {
      uVar14 = 0xfe;
    }
    uVar15 = uVar15 >> 8 & 0xff;
    if (0xfd < uVar15) {
      uVar15 = 0xfe;
    }
    uVar17 = uVar16 >> 0x10 & 0xff;
    if (0xfd < uVar17) {
      uVar17 = 0xfe;
    }
    uVar16 = uVar16 >> 0x18;
    if (0xfd < uVar16) {
      uVar16 = 0xfe;
    }
    bVar18 = true;
    iVar7 = 0;
    do {
      local_280 = (undefined1  [8])
                  ((local_408->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_278,"Verifying attachment ",0x15);
      std::ostream::operator<<((ostringstream *)&local_278,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"...",3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
      std::ios_base::~ios_base(local_208);
      (**(code **)(lVar12 + 0x1218))(iVar7 + 0x8ce0);
      local_3d8.order = RGBA;
      local_3d8.type = UNORM_INT8;
      data = (void *)local_428.m_pixels.m_cap;
      if ((void *)local_428.m_pixels.m_cap != (void *)0x0) {
        data = local_428.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_280,&local_3d8,local_428.m_width,local_428.m_height,1,
                 data);
      glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)local_280);
      dVar8 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar8,"Reading pixels failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                      ,0x148);
      expectedColor.m_value = 0xff0000ff;
      if (iVar7 == 0) {
        expectedColor.m_value = 0xff00ff00;
      }
      bVar6 = compareSingleColor(((local_408->super_TestCase).super_TestCase.super_TestNode.
                                 m_testCtx)->m_log,&local_428,expectedColor,
                                 (RGBA)(uVar16 * 0x1000000 + (uVar17 << 0x10 | uVar15 << 8 | uVar14)
                                       + 0x1010101));
      if (!bVar6) {
        bVar18 = false;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 2);
    description = "Image comparison failed";
    if (bVar18) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_408->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)~bVar18,description);
    tcu::Surface::~Surface(&local_428);
    lVar12 = -0xa0;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -10;
      lVar12 = lVar12 + 0x50;
    } while (lVar12 != 0);
    glu::ObjectWrapper::~ObjectWrapper(&local_370);
    glu::ObjectWrapper::~ObjectWrapper(&local_358);
    glu::ObjectWrapper::~ObjectWrapper(&local_340);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
             ,0x124);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glu::ShaderProgram		program			(renderCtx, glu::ProgramSources()
															<< glu::VertexSource(
																"attribute highp vec4 a_position;\n"
																"attribute highp vec4 a_color;\n"
																"varying mediump vec4 v_color;\n"
																"void main (void)\n"
																"{\n"
																"	gl_Position = a_position;\n"
																"	v_color = a_color;\n"
																"}\n")
															<< glu::FragmentSource(
																"varying mediump vec4 v_color;\n"
																"uniform mediump int u_index;\n"
																"void main (void)\n"
																"{\n"
																"	gl_FragData[u_index] = v_color;\n"
																"}\n"));
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const int						width			= 128;
		const int						height			= 128;
		const int						indexLoc		= program.isOk() ? gl.getUniformLocation(program.getProgram(), "u_index") : -1;
		const glu::Framebuffer			fbo				(renderCtx);
		const glu::Renderbuffer			colorBuf0		(renderCtx);
		const glu::Renderbuffer			colorBuf1		(renderCtx);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
			throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32	rbo	= ndx == 0 ? *colorBuf0 : *colorBuf1;

			gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, width, height);
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0+ndx, GL_RENDERBUFFER, rbo);
		}
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

		{
			const deUint32 drawBuffers[] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
			gl.drawBuffers(DE_LENGTH_OF_ARRAY(drawBuffers), &drawBuffers[0]);
		}

		gl.clearBufferfv(GL_COLOR, 0, tcu::RGBA::red().toVec().getPtr());
		gl.clearBufferfv(GL_COLOR, 1, tcu::RGBA::red().toVec().getPtr());

		gl.viewport		(0, 0, width, height);
		gl.useProgram	(program.getProgram());

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		m_testCtx.getLog() << TestLog::Message << "Drawing to attachments 0 and 1, expecting only attachment 0 to change." << TestLog::EndMessage;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			gl.uniform1i(indexLoc, ndx);
			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(width, height);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				allOk		= true;

			for (int ndx = 0; ndx < 2; ndx++)
			{
				m_testCtx.getLog() << TestLog::Message << "Verifying attachment " << ndx << "..." << TestLog::EndMessage;

				gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
				glu::readPixels(renderCtx, 0, 0, result.getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

				if (!compareSingleColor(m_testCtx.getLog(), result, ndx == 0 ? tcu::RGBA::green() : tcu::RGBA::red(), threshold))
					allOk = false;
			}

			m_testCtx.setTestResult(allOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}